

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

string * __thiscall
soul::AST::Connection::getDefaultEndpointName_abi_cxx11_
          (string *__return_storage_ptr__,Connection *this,Context *errorContext,ProcessorBase *p,
          bool wantInput)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  char *text;
  bool bVar4;
  undefined1 auVar5 [16];
  CompileMessage CStack_88;
  CompileMessage local_50;
  
  auVar5 = (**(code **)((long)&(((errorContext->location).sourceCode.object)->content).field_2 + 8))
                     (errorContext);
  plVar2 = auVar5._0_8_;
  if (plVar2 != auVar5._8_8_) {
    lVar3 = 0;
    do {
      lVar1 = *plVar2;
      if (((*(char *)(lVar1 + 0x61) == '\0') && (*(char *)(lVar1 + 0x28) == (char)p)) &&
         (bVar4 = lVar3 != 0, lVar3 = lVar1, bVar4)) {
        CompileMessageHelpers::createMessage<>
                  (&local_50,syntax,error,
                   "A processor can only be placed inside a chain if it has exactly one input and one output"
                  );
        Context::throwError((Context *)this,&local_50,false);
      }
      plVar2 = plVar2 + 1;
    } while (plVar2 != auVar5._8_8_);
    if (lVar3 != 0) {
      plVar2 = *(long **)(lVar3 + 0x30);
      if (plVar2 != (long *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
        return __return_storage_ptr__;
      }
      throwInternalCompilerError("isValid()","toString",0x23);
    }
  }
  text = "This processor has no suitable output endpoints";
  if ((char)p != '\0') {
    text = "This processor has no suitable input endpoints";
  }
  CompileMessageHelpers::createMessage<>(&CStack_88,syntax,error,text);
  Context::throwError((Context *)this,&CStack_88,false);
}

Assistant:

static std::string getDefaultEndpointName (const Context& errorContext, ProcessorBase& p, bool wantInput)
        {
            pool_ptr<EndpointDeclaration> found;

            for (auto& e : p.getEndpoints())
            {
                if (!e->isConsoleEndpoint && e->isInput == wantInput)
                {
                    if (found != nullptr)
                        errorContext.throwError (Errors::mustBeOnlyOneEndpoint());

                    found = e;
                }
            }

            if (found == nullptr)
                errorContext.throwError (wantInput ? Errors::processorHasNoSuitableInputs()
                                                   : Errors::processorHasNoSuitableOutputs());

            return found->name.toString();
        }